

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

int qpdf_get_num_pages(qpdf_data qpdf)

{
  qpdf_data qpdf_00;
  uint uVar1;
  anon_class_8_1_54a3980e local_48;
  function<void_(_qpdf_data_*)> local_40;
  int local_1c;
  QPDF_ERROR_CODE code;
  int n;
  qpdf_data qpdf_local;
  
  _code = qpdf;
  QTC::TC("qpdf","qpdf-c called qpdf_num_pages",0);
  qpdf_00 = _code;
  local_1c = -1;
  local_48.n = &local_1c;
  std::function<void(_qpdf_data*)>::function<qpdf_get_num_pages::__0,void>
            ((function<void(_qpdf_data*)> *)&local_40,&local_48);
  uVar1 = trap_errors(qpdf_00,&local_40);
  std::function<void_(_qpdf_data_*)>::~function(&local_40);
  if ((uVar1 & 2) == 0) {
    qpdf_local._4_4_ = local_1c;
  }
  else {
    qpdf_local._4_4_ = -1;
  }
  return qpdf_local._4_4_;
}

Assistant:

int
qpdf_get_num_pages(qpdf_data qpdf)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_num_pages");
    int n = -1;
    QPDF_ERROR_CODE code =
        trap_errors(qpdf, [&n](qpdf_data q) { n = QIntC::to_int(q->qpdf->getAllPages().size()); });
    if (code & QPDF_ERRORS) {
        return -1;
    }
    return n;
}